

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::determine_alpha_endpoints(dxt_hc *this)

{
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  tile_details *ptVar7;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar8;
  size_type sVar9;
  const_reference_conflict pvVar10;
  uint *puVar11;
  tile_details *ptVar12;
  color_quad<unsigned_char,_int> *this_00;
  vector<crnlib::dxt_hc::tile_details> *in_RDI;
  uint i_4;
  uint cluster_index;
  uint a_2;
  uint b;
  uint p;
  vector<crnlib::color_quad<unsigned_char,_int>_> *destination;
  vector<crnlib::color_quad<unsigned_char,_int>_> *source;
  uint t_1;
  uint component_index;
  uint a_1;
  uint i_3;
  tree_clusterizer<crnlib::vec<2U,_float>_> vq;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *endpoint;
  Node node_1;
  vector<unsigned_int> weights;
  vector<crnlib::vec<2U,_float>_> vectors;
  uint i_2;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> queue;
  uint i_1;
  uint i;
  Node node;
  vector<Node>_conflict1 nodes;
  uint t;
  uint a;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> endpoints;
  uint num_tasks;
  Node *in_stack_fffffffffffffc98;
  color_quad<unsigned_char,_int> *obj;
  tree_clusterizer<crnlib::vec<2U,_float>_> *in_stack_fffffffffffffca0;
  vec<2U,_float> *in_stack_fffffffffffffca8;
  undefined6 in_stack_fffffffffffffcb0;
  ushort in_stack_fffffffffffffcb6;
  value_type_conflict *in_stack_fffffffffffffcb8;
  task_pool *in_stack_fffffffffffffcc0;
  uint64 in_stack_fffffffffffffcc8;
  vector<crnlib::dxt_hc::tile_details> *this_01;
  dxt_hc *in_stack_fffffffffffffcd0;
  task_pool *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  uint local_1c8;
  uint local_1c0;
  uint local_1bc;
  uint local_1b4;
  uint local_19c;
  uint local_194;
  uint local_17c;
  undefined1 in_stack_fffffffffffffee7;
  uint in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  uint *in_stack_fffffffffffffef0;
  vec<2U,_float> *in_stack_fffffffffffffef8;
  tree_clusterizer<crnlib::vec<2U,_float>_> *in_stack_ffffffffffffff00;
  task_pool *in_stack_ffffffffffffff10;
  vector<unsigned_int> local_b8;
  vector<crnlib::vec<2U,_float>_> local_a8;
  uint local_94;
  uint local_70;
  uint local_6c;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_68;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_60;
  vector<Node> local_58;
  uint local_44;
  uint local_28;
  uint local_24;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> local_20;
  uint local_c;
  
  uVar3 = task_pool::get_num_threads(*(task_pool **)&in_RDI[0x89].m_size);
  local_c = uVar3 + 1;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::vector(&local_20);
  for (local_24 = 0; local_24 < *(uint *)&in_RDI[0x86].m_p; local_24 = local_24 + 1) {
    for (local_28 = 0; uVar6 = local_28, uVar3 = vector<crnlib::dxt_hc::tile_details>::size(in_RDI),
        uVar6 < uVar3; local_28 = local_28 + 1) {
      ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_28);
      uVar3 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar7->pixels);
      if (uVar3 != 0) {
        vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_28);
        ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_28);
        local_44 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar7->pixels);
        std::make_pair<crnlib::vec<2u,float>&,unsigned_int>
                  (in_stack_fffffffffffffca8,(uint *)in_stack_fffffffffffffca0);
        vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::push_back
                  ((vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
                   in_stack_fffffffffffffca0,
                   (pair<crnlib::vec<2U,_float>,_unsigned_int> *)in_stack_fffffffffffffc98);
      }
    }
  }
  vector<Node>::vector(&local_58);
  ppVar8 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::get_ptr(&local_20);
  determine_alpha_endpoints()::Node::Node(std::pair<crnlib::vec<2u,float>,unsigned_int>*,std::
  pair<crnlib::vec<2u,float>_unsigned_int>__
            (&local_68,(pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0,ppVar8);
  for (local_6c = 0; local_6c < local_c; local_6c = local_6c + 1) {
    local_68 = local_60;
    ppVar8 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::get_ptr(&local_20);
    uVar3 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::size(&local_20);
    local_60 = ppVar8 + (ulong)(uVar3 * (local_6c + 1)) / (ulong)local_c;
    if (local_68 != local_60) {
      vector<Node>::push_back
                ((vector<Node>_conflict1 *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    }
  }
  for (local_70 = 0; uVar6 = local_70, uVar3 = vector<Node>::size(&local_58), uVar6 < uVar3;
      local_70 = local_70 + 1) {
    vector<Node>::operator[](&local_58,local_70);
    task_pool::queue_task
              (in_stack_fffffffffffffcd8,(task_callback_func)in_stack_fffffffffffffcd0,
               in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  }
  task_pool::join(in_stack_fffffffffffffcc0);
  std::
  priority_queue<crnlib::dxt_hc::determine_alpha_endpoints()::Node,std::vector<crnlib::dxt_hc::determine_alpha_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>,std::less<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>
  ::
  priority_queue<std::vector<crnlib::dxt_hc::determine_alpha_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>,void>
            ((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> *)
             in_stack_fffffffffffffca0);
  local_94 = 0;
  while( true ) {
    uVar6 = local_94;
    uVar3 = vector<Node>::size(&local_58);
    uVar4 = (uint)(in_stack_fffffffffffffcc8 >> 0x20);
    if (uVar3 <= uVar6) break;
    vector<Node>::operator[](&local_58,local_94);
    std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
              ((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> *)
               in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    local_94 = local_94 + 1;
  }
  vector<crnlib::vec<2U,_float>_>::vector(&local_a8);
  vector<unsigned_int>::vector(&local_b8);
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::size(&local_20);
  vector<crnlib::vec<2U,_float>_>::reserve
            ((vector<crnlib::vec<2U,_float>_> *)in_stack_fffffffffffffcd0,uVar4);
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::size(&local_20);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)in_stack_fffffffffffffcd0,uVar4);
LAB_001ee57e:
  do {
    sVar9 = std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::
            size((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> *
                 )0x1ee58b);
    if (sVar9 == 0) {
      tree_clusterizer<crnlib::vec<2U,_float>_>::tree_clusterizer
                ((tree_clusterizer<crnlib::vec<2U,_float>_> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      vector<crnlib::vec<2U,_float>_>::get_ptr(&local_a8);
      vector<unsigned_int>::get_ptr(&local_b8);
      vector<crnlib::vec<2U,_float>_>::size(&local_a8);
      math::minimum<unsigned_int>(*(uint *)&in_RDI[1].m_p,*(uint *)((long)&in_RDI[0x82].m_p + 4));
      obj = *(color_quad<unsigned_char,_int> **)&in_RDI[0x89].m_size;
      tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7
                 ,in_stack_ffffffffffffff10);
      tree_clusterizer<crnlib::vec<2U,_float>_>::get_codebook_size
                ((tree_clusterizer<crnlib::vec<2U,_float>_> *)0x1ee881);
      vector<crnlib::dxt_hc::alpha_cluster>::resize
                ((vector<crnlib::dxt_hc::alpha_cluster> *)
                 CONCAT26(in_stack_fffffffffffffcb6,in_stack_fffffffffffffcb0),
                 (uint)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffca8 >> 0x18,0));
      for (local_17c = 0; local_17c < local_c; local_17c = local_17c + 1) {
        task_pool::
        queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                  (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                   (offset_in_dxt_hc_to_subr)in_stack_fffffffffffffcc0,
                   (uint64)in_stack_fffffffffffffcb8,
                   (void *)CONCAT26(in_stack_fffffffffffffcb6,in_stack_fffffffffffffcb0));
      }
      task_pool::join(in_stack_fffffffffffffcc0);
      for (local_194 = 0; local_194 < *(uint *)&in_RDI[0x86].m_p; local_194 = local_194 + 1) {
        uVar3 = (&in_RDI[0x83].m_size)[local_194];
        for (local_19c = 0; local_19c < *(uint *)&in_RDI[100].m_p; local_19c = local_19c + 1) {
          ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_19c);
          uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar7->pixels);
          if (uVar4 != 0) {
            ptVar12 = vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_19c);
            vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                      ((vector<crnlib::dxt_hc::alpha_cluster> *)&in_RDI[0x87].m_size,
                       (uint)ptVar12->cluster_indices[local_194 + 1]);
            local_1b4 = 0;
            while (uVar4 = local_1b4,
                  uVar5 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar7->pixels),
                  uVar4 < uVar5) {
              this_00 = vector<crnlib::color_quad<unsigned_char,_int>_>::operator[]
                                  (&ptVar7->pixels,local_1b4);
              in_stack_fffffffffffffcd8 =
                   (task_pool *)color_quad<unsigned_char,_int>::operator[](this_00,uVar3);
              color_quad<unsigned_char,_int>::color_quad
                        ((color_quad<unsigned_char,_int> *)in_stack_fffffffffffffca0,
                         (int)((ulong)obj >> 0x20),(int)obj);
              vector<crnlib::color_quad<unsigned_char,_int>_>::push_back
                        ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                         in_stack_fffffffffffffca0,obj);
              local_1b4 = local_1b4 + 1;
            }
          }
        }
      }
      for (local_1bc = 0; local_1bc < *(uint *)&in_RDI[100].m_p; local_1bc = local_1bc + 1) {
        for (local_1c0 = 0; local_1c0 < *(uint *)&in_RDI[0x86].m_p; local_1c0 = local_1c0 + 1) {
          this_01 = in_RDI;
          in_stack_fffffffffffffcd0 =
               (dxt_hc *)
               vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)&in_RDI[0x6d].m_size,local_1bc);
          in_stack_fffffffffffffcc0 =
               (task_pool *)
               vector<crnlib::dxt_hc::tile_details>::operator[]
                         (this_01,*(uint *)&(in_stack_fffffffffffffcd0->m_tiles).m_p);
          in_stack_fffffffffffffcb6 =
               *(ushort *)
                ((long)&(in_stack_fffffffffffffcc0->m_task_stack).m_stack[1].field_2 +
                (ulong)(local_1c0 + 1) * 2 + 4);
          uVar6 = (uint)in_stack_fffffffffffffcb6;
          in_stack_fffffffffffffcb8 =
               (value_type_conflict *)
               vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                         ((vector<crnlib::dxt_hc::endpoint_indices_details> *)&in_RDI[0x6e].m_size,
                          local_1bc);
          ((anon_union_6_2_7fbd2915_for_endpoint_indices_details_0 *)&in_stack_fffffffffffffcb8->p)
          ->component[local_1c0 + 1] = in_stack_fffffffffffffcb6;
          if ((((ulong)in_RDI[0x86].m_p & 0x1000000000000) == 0) || ((local_1bc & 1) == 0)) {
            vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                      ((vector<crnlib::dxt_hc::alpha_cluster> *)&in_RDI[0x87].m_size,uVar6);
            vector<unsigned_int>::push_back
                      ((vector<unsigned_int> *)in_stack_fffffffffffffca0,(uint *)obj);
          }
        }
      }
      for (local_1c8 = 0; local_1c8 < local_c; local_1c8 = local_1c8 + 1) {
        task_pool::
        queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                  (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                   (offset_in_dxt_hc_to_subr)in_stack_fffffffffffffcc0,
                   (uint64)in_stack_fffffffffffffcb8,
                   (void *)CONCAT26(in_stack_fffffffffffffcb6,in_stack_fffffffffffffcb0));
      }
      task_pool::join(in_stack_fffffffffffffcc0);
      tree_clusterizer<crnlib::vec<2U,_float>_>::~tree_clusterizer(in_stack_fffffffffffffca0);
      vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffca0);
      vector<crnlib::vec<2U,_float>_>::~vector
                ((vector<crnlib::vec<2U,_float>_> *)in_stack_fffffffffffffca0);
      std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::
      ~priority_queue((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>
                       *)0x1eedc0);
      vector<Node>::~vector((vector<Node>_conflict1 *)in_stack_fffffffffffffca0);
      vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::~vector
                ((vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
                 in_stack_fffffffffffffca0);
      return;
    }
    pvVar10 = std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>
              ::top((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>
                     *)0x1ee5b4);
    ppVar8 = pvVar10->p;
    ppVar1 = pvVar10->pEnd;
    std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::pop
              ((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> *)
               CONCAT26(in_stack_fffffffffffffcb6,in_stack_fffffffffffffcb0));
    if (ppVar8 + 1 != ppVar1) {
      std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                ((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> *
                 )in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    }
    uVar3 = vector<crnlib::vec<2U,_float>_>::size(&local_a8);
    if (uVar3 != 0) {
      vector<crnlib::vec<2U,_float>_>::back(&local_a8);
      bVar2 = helpers::operator!=((vec<2U,_float> *)in_stack_fffffffffffffca0,
                                  (vec<2U,_float> *)in_stack_fffffffffffffc98);
      if (!bVar2) {
        puVar11 = vector<unsigned_int>::back(&local_b8);
        if (-ppVar8->second - 1 < *puVar11) {
          puVar11 = vector<unsigned_int>::back(&local_b8);
          *puVar11 = 0xffffffff;
        }
        else {
          uVar6 = ppVar8->second;
          puVar11 = vector<unsigned_int>::back(&local_b8);
          *puVar11 = uVar6 + *puVar11;
        }
        goto LAB_001ee57e;
      }
    }
    vector<crnlib::vec<2U,_float>_>::push_back
              ((vector<crnlib::vec<2U,_float>_> *)in_stack_fffffffffffffca0,
               (vec<2U,_float> *)in_stack_fffffffffffffc98);
    vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)in_stack_fffffffffffffca0,(uint *)in_stack_fffffffffffffc98);
  } while( true );
}

Assistant:

void dxt_hc::determine_alpha_endpoints() {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  crnlib::vector<std::pair<vec2F, uint> > endpoints;
  for (uint a = 0; a < m_num_alpha_blocks; a++) {
    for (uint t = 0; t < m_tiles.size(); t++) {
      if (m_tiles[t].pixels.size())
        endpoints.push_back(std::make_pair(m_tiles[t].alpha_endpoints[a], m_tiles[t].pixels.size()));
    }
  }

  struct Node {
    std::pair<vec2F, uint> *p, *pEnd;
    Node (std::pair<vec2F, uint>* begin, std::pair<vec2F, uint>* end) : p(begin), pEnd(end) {}
    bool operator<(const Node& other) const { return *p > *other.p; }
    static void sort_task(uint64 data, void* ptr) { std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd); }
  };

  crnlib::vector<Node> nodes;
  Node node(0, endpoints.get_ptr());
  for (uint i = 0; i < num_tasks; i++) {
    node.p = node.pEnd;
    node.pEnd = endpoints.get_ptr() + endpoints.size() * (i + 1) / num_tasks;
    if (node.p != node.pEnd)
      nodes.push_back(node);
  }

  for (uint i = 0; i < nodes.size(); i++)
    m_pTask_pool->queue_task(&Node::sort_task, i, &nodes[i]);
  m_pTask_pool->join();

  std::priority_queue<Node> queue;
  for (uint i = 0; i < nodes.size(); i++)
    queue.push(nodes[i]);

  crnlib::vector<vec2F> vectors;
  crnlib::vector<uint> weights;
  vectors.reserve(endpoints.size());
  weights.reserve(endpoints.size());
  while (queue.size()) {
    Node node = queue.top();
    std::pair<vec2F, uint>* endpoint = node.p++;
    queue.pop();
    if (node.p != node.pEnd)
      queue.push(node);
    if (!vectors.size() || endpoint->first != vectors.back()) {
      vectors.push_back(endpoint->first);
      weights.push_back(endpoint->second);
    } else if (weights.back() > UINT_MAX - endpoint->second) {
      weights.back() = UINT_MAX;
    } else {
      weights.back() += endpoint->second;
    }
  }

  tree_clusterizer<vec2F> vq;
  vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), math::minimum<uint>(m_num_tiles, m_params.m_alpha_endpoint_codebook_size), false, m_pTask_pool);
  m_alpha_clusters.resize(vq.get_codebook_size());

  for (uint i = 0; i < num_tasks; i++)
    m_pTask_pool->queue_object_task(this, &dxt_hc::determine_alpha_endpoint_clusters_task, i, &vq);
  m_pTask_pool->join();

  for (uint a = 0; a < m_num_alpha_blocks; a++) {
    uint component_index = m_params.m_alpha_component_indices[a];
    for (uint t = 0; t < m_num_blocks; t++) {
      crnlib::vector<color_quad_u8>& source = m_tiles[t].pixels;
      if (source.size()) {
        crnlib::vector<color_quad_u8>& destination = m_alpha_clusters[m_tiles[t].cluster_indices[cAlpha0 + a]].pixels;
        for (uint p = 0; p < source.size(); p++)
          destination.push_back(color_quad_u8(source[p][component_index]));
      }
    }
  }

  for (uint b = 0; b < m_num_blocks; b++) {
    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint cluster_index = m_tiles[m_tile_indices[b]].cluster_indices[cAlpha0 + a];
      m_endpoint_indices[b].component[cAlpha0 + a] = cluster_index;
      if (!(m_has_subblocks && b & 1))
        m_alpha_clusters[cluster_index].blocks[cAlpha0 + a].push_back(b);
    }
  }

  for (uint i = 0; i < num_tasks; i++)
    m_pTask_pool->queue_object_task(this, &dxt_hc::determine_alpha_endpoint_codebook_task, i, NULL);
  m_pTask_pool->join();
}